

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar4;
  void *_v_1;
  void *_v;
  QGraphicsBlurEffect *_t;
  undefined4 in_stack_ffffffffffffff68;
  QFlagsStorage<QGraphicsBlurEffect::BlurHint> in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QGraphicsBlurEffect *in_stack_ffffffffffffff78;
  QGraphicsBlurEffect *pQVar5;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  QFlagsStorage<QGraphicsBlurEffect::BlurHint> hints;
  
  hints.i = (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    uVar3 = (ulong)in_EDX;
    switch(uVar3) {
    case 0:
      blurRadiusChanged((QGraphicsBlurEffect *)0x4a6203,
                        (qreal)CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68));
      break;
    case 1:
      blurHintsChanged((QGraphicsBlurEffect *)0x4a6228,(BlurHints)in_stack_ffffffffffffff6c.i);
      break;
    case 2:
      setBlurRadius((QGraphicsBlurEffect *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (qreal)in_stack_ffffffffffffff78);
      break;
    case 3:
      setBlurHints(in_stack_ffffffffffffff78,(BlurHints)0x0);
    }
    hints.i = (Int)(uVar3 >> 0x20);
  }
  if ((in_ESI != 5) ||
     ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsBlurEffect::*)(double)>
                         (in_RCX,(void **)blurRadiusChanged,0,0), !bVar2 &&
      (bVar2 = QtMocHelpers::
               indexOfMethod<void(QGraphicsBlurEffect::*)(QFlags<QGraphicsBlurEffect::BlurHint>)>
                         (in_RCX,(void **)blurHintsChanged,0,1), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar5 = *(QGraphicsBlurEffect **)in_RCX;
      in_stack_ffffffffffffff84 = in_EDX;
      if (in_EDX == 0) {
        qVar4 = blurRadius((QGraphicsBlurEffect *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        *(qreal *)&pQVar5->super_QGraphicsEffect = qVar4;
      }
      else if (in_EDX == 1) {
        blurHints((QGraphicsBlurEffect *)
                  CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68));
        QtMocHelpers::assignFlags<QFlags<QGraphicsBlurEffect::BlurHint>>
                  ((void *)0x4a634c,
                   (QFlags<QGraphicsBlurEffect::BlurHint>)in_stack_ffffffffffffff6c.i);
        in_stack_ffffffffffffff78 = pQVar5;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setBlurRadius((QGraphicsBlurEffect *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (qreal)in_stack_ffffffffffffff78);
      }
      else if (in_EDX == 1) {
        setBlurHints(in_stack_ffffffffffffff78,(BlurHints)hints.i);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsBlurEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->blurHintsChanged((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        case 2: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setBlurHints((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(qreal )>(_a, &QGraphicsBlurEffect::blurRadiusChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(BlurHints )>(_a, &QGraphicsBlurEffect::blurHintsChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 1: QtMocHelpers::assignFlags<BlurHints>(_v, _t->blurHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setBlurHints(*reinterpret_cast<BlurHints*>(_v)); break;
        default: break;
        }
    }
}